

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void http_mime_parser_on_partial_start
               (http_mime_parser_s *parser,void *name,size_t name_len,void *filename,
               size_t filename_len,void *mimetype,size_t mimetype_len)

{
  FIOBJ FVar1;
  fio_str_info_s local_68;
  undefined1 local_50 [8];
  fio_str_info_s tmp;
  void *mimetype_local;
  size_t filename_len_local;
  void *filename_local;
  size_t name_len_local;
  void *name_local;
  http_mime_parser_s *parser_local;
  
  parser[3].boundary = (char *)0x0;
  parser[2].in_obj = '\0';
  parser[2].done = '\0';
  parser[2].error = '\0';
  *(undefined5 *)&parser[2].field_0x13 = 0;
  tmp.data = (char *)mimetype;
  FVar1 = fiobj_str_new((char *)name,name_len);
  parser[3].boundary_len = FVar1;
  if (filename != (void *)0x0) {
    fiobj_str_write(parser[3].boundary_len,"[type]",6);
    fiobj_obj2cstr((fio_str_info_s *)local_50,parser[3].boundary_len);
    http_add2hash(*(FIOBJ *)(parser[1].boundary + 0x68),(char *)tmp.len,tmp.capa,tmp.data,
                  mimetype_len,'\0');
    fiobj_str_resize(parser[3].boundary_len,name_len);
    fiobj_str_write(parser[3].boundary_len,"[name]",6);
    fiobj_obj2cstr(&local_68,parser[3].boundary_len);
    local_50 = (undefined1  [8])local_68.capa;
    tmp.capa = local_68.len;
    tmp.len = (size_t)local_68.data;
    http_add2hash(*(FIOBJ *)(parser[1].boundary + 0x68),local_68.data,local_68.len,(char *)filename,
                  filename_len,'\0');
    fiobj_str_resize(parser[3].boundary_len,name_len);
    fiobj_str_write(parser[3].boundary_len,"[data]",6);
  }
  return;
}

Assistant:

static void http_mime_parser_on_partial_start(
    http_mime_parser_s *parser, void *name, size_t name_len, void *filename,
    size_t filename_len, void *mimetype, size_t mimetype_len) {
  http_mime_parser2fio(parser)->partial_length = 0;
  http_mime_parser2fio(parser)->partial_offset = 0;
  http_mime_parser2fio(parser)->partial_name = fiobj_str_new(name, name_len);

  if (!filename)
    return;

  fiobj_str_write(http_mime_parser2fio(parser)->partial_name, "[type]", 6);
  fio_str_info_s tmp =
      fiobj_obj2cstr(http_mime_parser2fio(parser)->partial_name);
  http_add2hash(http_mime_parser2fio(parser)->h->params, tmp.data, tmp.len,
                mimetype, mimetype_len, 0);

  fiobj_str_resize(http_mime_parser2fio(parser)->partial_name, name_len);
  fiobj_str_write(http_mime_parser2fio(parser)->partial_name, "[name]", 6);
  tmp = fiobj_obj2cstr(http_mime_parser2fio(parser)->partial_name);
  http_add2hash(http_mime_parser2fio(parser)->h->params, tmp.data, tmp.len,
                filename, filename_len, 0);

  fiobj_str_resize(http_mime_parser2fio(parser)->partial_name, name_len);
  fiobj_str_write(http_mime_parser2fio(parser)->partial_name, "[data]", 6);
}